

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void Mean16x4_SSE2(uint8_t *ref,uint32_t *dc)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int *in_RSI;
  ulong *in_RDI;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  __m128i c3;
  __m128i c2;
  __m128i c1;
  __m128i c0;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  __m128i mask;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int iStack_174;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int iStack_154;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int iStack_134;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int iStack_114;
  int iStack_10c;
  uint16_t tmp [8];
  __m128i f0;
  __m128i e1;
  __m128i e0;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  uVar3 = in_RDI[4];
  uVar4 = in_RDI[5];
  uVar5 = in_RDI[8];
  uVar6 = in_RDI[9];
  uVar7 = in_RDI[0xc];
  uVar8 = in_RDI[0xd];
  d1[1]._0_2_ = (ushort)uVar1;
  d1[1]._2_2_ = (ushort)(uVar1 >> 0x10);
  d1[1]._4_2_ = (ushort)(uVar1 >> 0x20);
  d0[0]._0_2_ = (ushort)uVar2;
  d0[0]._2_2_ = (ushort)(uVar2 >> 0x10);
  d0[0]._4_2_ = (ushort)(uVar2 >> 0x20);
  d3[1]._0_2_ = (ushort)uVar3;
  d3[1]._2_2_ = (ushort)(uVar3 >> 0x10);
  d3[1]._4_2_ = (ushort)(uVar3 >> 0x20);
  d2[0]._0_2_ = (ushort)uVar4;
  d2[0]._2_2_ = (ushort)(uVar4 >> 0x10);
  d2[0]._4_2_ = (ushort)(uVar4 >> 0x20);
  e1[1]._0_2_ = (ushort)uVar5;
  e1[1]._2_2_ = (ushort)(uVar5 >> 0x10);
  e1[1]._4_2_ = (ushort)(uVar5 >> 0x20);
  e0[0]._0_2_ = (ushort)uVar6;
  e0[0]._2_2_ = (ushort)(uVar6 >> 0x10);
  e0[0]._4_2_ = (ushort)(uVar6 >> 0x20);
  tmp[4] = (uint16_t)uVar7;
  tmp[5] = (uint16_t)(uVar7 >> 0x10);
  tmp[6] = (uint16_t)(uVar7 >> 0x20);
  f0[0]._0_2_ = (ushort)uVar8;
  f0[0]._2_2_ = (ushort)(uVar8 >> 0x10);
  f0[0]._4_2_ = (ushort)(uVar8 >> 0x20);
  iVar15 = CONCAT22(d1[1]._2_2_ >> 8,(ushort)d1[1] >> 8);
  iVar16 = CONCAT22(d0[0]._2_2_ >> 8,(ushort)d0[0] >> 8);
  iStack_114 = (int)(CONCAT26((ushort)(uVar1 >> 0x38),CONCAT24(d1[1]._4_2_ >> 8,iVar15)) >> 0x20);
  iStack_10c = (int)(CONCAT26((ushort)(uVar2 >> 0x38),CONCAT24(d0[0]._4_2_ >> 8,iVar16)) >> 0x20);
  local_128 = (int)(uVar1 & 0xff00ff00ff00ff);
  iStack_124 = (int)((uVar1 & 0xff00ff00ff00ff) >> 0x20);
  iStack_120 = (int)(uVar2 & 0xff00ff00ff00ff);
  iStack_11c = (int)((uVar2 & 0xff00ff00ff00ff) >> 0x20);
  iVar13 = CONCAT22(d3[1]._2_2_ >> 8,(ushort)d3[1] >> 8);
  iVar14 = CONCAT22(d2[0]._2_2_ >> 8,(ushort)d2[0] >> 8);
  iStack_134 = (int)(CONCAT26((ushort)(uVar3 >> 0x38),CONCAT24(d3[1]._4_2_ >> 8,iVar13)) >> 0x20);
  iStack_12c = (int)(CONCAT26((ushort)(uVar4 >> 0x38),CONCAT24(d2[0]._4_2_ >> 8,iVar14)) >> 0x20);
  local_148 = (int)(uVar3 & 0xff00ff00ff00ff);
  iStack_144 = (int)((uVar3 & 0xff00ff00ff00ff) >> 0x20);
  iStack_140 = (int)(uVar4 & 0xff00ff00ff00ff);
  iStack_13c = (int)((uVar4 & 0xff00ff00ff00ff) >> 0x20);
  iVar11 = CONCAT22(e1[1]._2_2_ >> 8,(ushort)e1[1] >> 8);
  iVar12 = CONCAT22(e0[0]._2_2_ >> 8,(ushort)e0[0] >> 8);
  iStack_154 = (int)(CONCAT26((ushort)(uVar5 >> 0x38),CONCAT24(e1[1]._4_2_ >> 8,iVar11)) >> 0x20);
  iStack_14c = (int)(CONCAT26((ushort)(uVar6 >> 0x38),CONCAT24(e0[0]._4_2_ >> 8,iVar12)) >> 0x20);
  local_168 = (int)(uVar5 & 0xff00ff00ff00ff);
  iStack_164 = (int)((uVar5 & 0xff00ff00ff00ff) >> 0x20);
  iStack_160 = (int)(uVar6 & 0xff00ff00ff00ff);
  iStack_15c = (int)((uVar6 & 0xff00ff00ff00ff) >> 0x20);
  iVar9 = CONCAT22(tmp[5] >> 8,tmp[4] >> 8);
  iVar10 = CONCAT22(f0[0]._2_2_ >> 8,(ushort)f0[0] >> 8);
  iStack_174 = (int)(CONCAT26((ushort)(uVar7 >> 0x38),CONCAT24(tmp[6] >> 8,iVar9)) >> 0x20);
  iStack_16c = (int)(CONCAT26((ushort)(uVar8 >> 0x38),CONCAT24(f0[0]._4_2_ >> 8,iVar10)) >> 0x20);
  local_188 = (int)(uVar7 & 0xff00ff00ff00ff);
  iStack_184 = (int)((uVar7 & 0xff00ff00ff00ff) >> 0x20);
  iStack_180 = (int)(uVar8 & 0xff00ff00ff00ff);
  iStack_17c = (int)((uVar8 & 0xff00ff00ff00ff) >> 0x20);
  uVar17 = iVar15 + local_128 + iVar13 + local_148 + iVar11 + local_168 + iVar9 + local_188;
  uVar18 = iStack_114 + iStack_124 + iStack_134 + iStack_144 +
           iStack_154 + iStack_164 + iStack_174 + iStack_184;
  uVar19 = iVar16 + iStack_120 + iVar14 + iStack_140 + iVar12 + iStack_160 + iVar10 + iStack_180;
  uVar20 = iStack_10c + iStack_11c + iStack_12c + iStack_13c +
           iStack_14c + iStack_15c + iStack_16c + iStack_17c;
  *in_RSI = (uVar17 & 0xffff) + (uVar17 >> 0x10);
  in_RSI[1] = (uVar18 & 0xffff) + (uVar18 >> 0x10);
  in_RSI[2] = (uVar19 & 0xffff) + (uVar19 >> 0x10);
  in_RSI[3] = (uVar20 & 0xffff) + (uVar20 >> 0x10);
  return;
}

Assistant:

static void Mean16x4_SSE2(const uint8_t* ref, uint32_t dc[4]) {
  const __m128i mask = _mm_set1_epi16(0x00ff);
  const __m128i a0 = _mm_loadu_si128((const __m128i*)&ref[BPS * 0]);
  const __m128i a1 = _mm_loadu_si128((const __m128i*)&ref[BPS * 1]);
  const __m128i a2 = _mm_loadu_si128((const __m128i*)&ref[BPS * 2]);
  const __m128i a3 = _mm_loadu_si128((const __m128i*)&ref[BPS * 3]);
  const __m128i b0 = _mm_srli_epi16(a0, 8);     // hi byte
  const __m128i b1 = _mm_srli_epi16(a1, 8);
  const __m128i b2 = _mm_srli_epi16(a2, 8);
  const __m128i b3 = _mm_srli_epi16(a3, 8);
  const __m128i c0 = _mm_and_si128(a0, mask);   // lo byte
  const __m128i c1 = _mm_and_si128(a1, mask);
  const __m128i c2 = _mm_and_si128(a2, mask);
  const __m128i c3 = _mm_and_si128(a3, mask);
  const __m128i d0 = _mm_add_epi32(b0, c0);
  const __m128i d1 = _mm_add_epi32(b1, c1);
  const __m128i d2 = _mm_add_epi32(b2, c2);
  const __m128i d3 = _mm_add_epi32(b3, c3);
  const __m128i e0 = _mm_add_epi32(d0, d1);
  const __m128i e1 = _mm_add_epi32(d2, d3);
  const __m128i f0 = _mm_add_epi32(e0, e1);
  uint16_t tmp[8];
  _mm_storeu_si128((__m128i*)tmp, f0);
  dc[0] = tmp[0] + tmp[1];
  dc[1] = tmp[2] + tmp[3];
  dc[2] = tmp[4] + tmp[5];
  dc[3] = tmp[6] + tmp[7];
}